

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_qprintpropertieswidget.h
# Opt level: O2

void __thiscall
Ui_QPrintPropertiesWidget::retranslateUi
          (Ui_QPrintPropertiesWidget *this,QWidget *QPrintPropertiesWidget)

{
  QWidget *pQVar1;
  QLabel *pQVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::translate((char *)&local_50,"QPrintPropertiesWidget","Form",0);
  QWidget::setWindowTitle((QString *)QPrintPropertiesWidget);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = (QWidget *)this->tabs;
  uVar3 = QTabWidget::indexOf(pQVar1);
  QCoreApplication::translate((char *)&local_50,"QPrintPropertiesWidget","Page",0);
  QTabWidget::setTabText((int)pQVar1,(QString *)(ulong)uVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = (QWidget *)this->tabs;
  uVar3 = QTabWidget::indexOf(pQVar1);
  QCoreApplication::translate((char *)&local_50,"QPrintPropertiesWidget","Advanced",0);
  QTabWidget::setTabText((int)pQVar1,(QString *)(ulong)uVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->conflictsLabel;
  QCoreApplication::translate
            ((char *)&local_50,"QPrintPropertiesWidget",
             "There are conflicts in some options. Please fix them.",0);
  QLabel::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void retranslateUi(QWidget *QPrintPropertiesWidget)
    {
        QPrintPropertiesWidget->setWindowTitle(QCoreApplication::translate("QPrintPropertiesWidget", "Form", nullptr));
        tabs->setTabText(tabs->indexOf(tabPage), QCoreApplication::translate("QPrintPropertiesWidget", "Page", nullptr));
        tabs->setTabText(tabs->indexOf(cupsPropertiesPage), QCoreApplication::translate("QPrintPropertiesWidget", "Advanced", nullptr));
        conflictsLabel->setText(QCoreApplication::translate("QPrintPropertiesWidget", "There are conflicts in some options. Please fix them.", nullptr));
    }